

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_getenv(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__name;
  char *str;
  ulong uVar1;
  int64_t iVar2;
  ulong uVar3;
  JSValue JVar4;
  
  __name = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__name == (char *)0x0) {
    iVar2 = 6;
  }
  else {
    str = getenv(__name);
    JS_FreeCString(ctx,__name);
    if (str != (char *)0x0) {
      JVar4 = JS_NewString(ctx,str);
      iVar2 = JVar4.tag;
      uVar1 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
      uVar3 = (ulong)JVar4.u._0_4_;
      goto LAB_0011180a;
    }
    iVar2 = 3;
  }
  uVar3 = 0;
  uVar1 = 0;
LAB_0011180a:
  JVar4.tag = iVar2;
  JVar4.u.ptr = (void *)(uVar3 | uVar1);
  return JVar4;
}

Assistant:

static JSValue js_std_getenv(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *name, *str;
    name = JS_ToCString(ctx, argv[0]);
    if (!name)
        return JS_EXCEPTION;
    str = getenv(name);
    JS_FreeCString(ctx, name);
    if (!str)
        return JS_UNDEFINED;
    else
        return JS_NewString(ctx, str);
}